

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9AbsDerive(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    pGVar3 = pAbc->pGia;
    if (pGVar3 != (Gia_Man_t *)0x0) {
      if (pGVar3->nRegs == 0) {
        pcVar4 = "The network is combinational.\n";
      }
      else {
        if (pGVar3->vFlopClasses != (Vec_Int_t *)0x0) {
          pGVar3 = Gia_ManDupAbsFlops(pGVar3,pGVar3->vFlopClasses);
          Abc_FrameUpdateGia(pAbc,pGVar3);
          return 0;
        }
        pcVar4 = "Abstraction flop map is missing.\n";
      }
      Abc_Print(-1,pcVar4);
      return 0;
    }
    pcVar4 = "Abc_CommandAbc9AbsDerive(): There is no AIG.\n";
    iVar2 = -1;
  }
  else {
    Abc_Print(-2,"usage: &abs_derive [-vh]\n");
    Abc_Print(-2,"\t        derives abstracted model using the pre-computed flop map\n");
    pcVar4 = "yes";
    if (!bVar1) {
      pcVar4 = "no";
    }
    Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar4);
    pcVar4 = "\t-h    : print the command usage\n";
    iVar2 = -2;
  }
  Abc_Print(iVar2,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9AbsDerive( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp = NULL;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9AbsDerive(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pAbc->pGia->vFlopClasses == NULL )
    {
        Abc_Print( -1, "Abstraction flop map is missing.\n" );
        return 0;
    }
    pTemp = Gia_ManDupAbsFlops( pAbc->pGia, pAbc->pGia->vFlopClasses );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &abs_derive [-vh]\n" );
    Abc_Print( -2, "\t        derives abstracted model using the pre-computed flop map\n" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}